

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_get_unordered_set_Test::TestBody(ObjectTest_basic_get_unordered_set_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  AssertHelper local_a08 [8];
  Message local_a00 [8];
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  local_9f8;
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  local_9b8;
  bool local_979;
  undefined1 local_978 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_948 [8];
  Message local_940 [8];
  unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_938;
  unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_8f8;
  bool local_8b9;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_888 [8];
  Message local_880 [8];
  unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  local_878;
  unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  local_838;
  bool local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_7c8 [8];
  Message local_7c0 [8];
  unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_> local_7b8
  ;
  unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_> local_778
  ;
  bool local_739;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_708 [8];
  Message local_700 [8];
  unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> local_6f8;
  unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> local_6b8;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_648 [8];
  Message local_640 [8];
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_638;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_5f8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_588 [8];
  Message local_580 [8];
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  local_578;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  local_538;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_4c8 [8];
  Message local_4c0 [8];
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_4b8;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_478;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_408 [8];
  Message local_400 [8];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_3f8;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_3b8;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_348 [8];
  Message local_340 [8];
  unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> local_338;
  unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> local_2f8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_288 [8];
  Message local_280 [8];
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  local_278;
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  local_238;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1c8 [8];
  Message local_1c0 [8];
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  local_1b8;
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  local_178;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_108 [8];
  Message local_100 [24];
  unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> local_e8;
  unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> local_a8;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  object obj;
  ObjectTest_basic_get_unordered_set_Test *this_local;
  
  jessilib::object::object((object *)&gtest_ar_.message_);
  local_e8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_e8._M_h._M_rehash_policy._4_4_ = 0;
  local_e8._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_h._M_element_count = 0;
  local_e8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_e8._M_h._M_bucket_count = 0;
  local_e8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  unordered_set(&local_e8);
  jessilib::object::
  get<std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_nullptr>
            (&local_a8,(object *)&gtest_ar_.message_,&local_e8);
  local_69 = std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
             empty(&local_a8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  ~unordered_set(&local_a8);
  std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  ~unordered_set(&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_68,
               "obj.get<std::unordered_set<bool>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_1b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_1b8._M_h._M_rehash_policy._4_4_ = 0;
  local_1b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_1b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b8._M_h._M_element_count = 0;
  local_1b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_1b8._M_h._M_bucket_count = 0;
  local_1b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::unordered_set(&local_1b8);
  jessilib::object::
  get<std::unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_std::unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            (&local_178,(object *)&gtest_ar_.message_,&local_1b8);
  local_139 = std::
              unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              ::empty(&local_178);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  std::
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::~unordered_set(&local_178);
  std::
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::~unordered_set(&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_138,
               "obj.get<std::unordered_set<signed char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_278._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_278._M_h._M_rehash_policy._4_4_ = 0;
  local_278._M_h._M_rehash_policy._M_next_resize = 0;
  local_278._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278._M_h._M_element_count = 0;
  local_278._M_h._M_buckets = (__buckets_ptr)0x0;
  local_278._M_h._M_bucket_count = 0;
  local_278._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::unordered_set(&local_278);
  jessilib::object::
  get<std::unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_std::unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_238,(object *)&gtest_ar_.message_,&local_278);
  local_1f9 = std::
              unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              ::empty(&local_238);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  std::
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~unordered_set(&local_238);
  std::
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~unordered_set(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_1f8,
               "obj.get<std::unordered_set<unsigned char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=(local_288,local_280);
    testing::internal::AssertHelper::~AssertHelper(local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_338._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_338._M_h._M_rehash_policy._4_4_ = 0;
  local_338._M_h._M_rehash_policy._M_next_resize = 0;
  local_338._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_338._M_h._M_element_count = 0;
  local_338._M_h._M_buckets = (__buckets_ptr)0x0;
  local_338._M_h._M_bucket_count = 0;
  local_338._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  unordered_set(&local_338);
  jessilib::object::
  get<std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_nullptr>
            (&local_2f8,(object *)&gtest_ar_.message_,&local_338);
  local_2b9 = std::
              unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
              empty(&local_2f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  ~unordered_set(&local_2f8);
  std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  ~unordered_set(&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_2b8,
               "obj.get<std::unordered_set<short>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=(local_348,local_340);
    testing::internal::AssertHelper::~AssertHelper(local_348);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_3f8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_3f8._M_h._M_rehash_policy._4_4_ = 0;
  local_3f8._M_h._M_rehash_policy._M_next_resize = 0;
  local_3f8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_3f8._M_h._M_element_count = 0;
  local_3f8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_3f8._M_h._M_bucket_count = 0;
  local_3f8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            (&local_3f8);
  jessilib::object::
  get<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_nullptr>
            (&local_3b8,(object *)&gtest_ar_.message_,&local_3f8);
  local_379 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
              empty(&local_3b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            (&local_3b8);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            (&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_378,
               "obj.get<std::unordered_set<int>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=(local_408,local_400);
    testing::internal::AssertHelper::~AssertHelper(local_408);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_4b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_4b8._M_h._M_rehash_policy._4_4_ = 0;
  local_4b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_4b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4b8._M_h._M_element_count = 0;
  local_4b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_4b8._M_h._M_bucket_count = 0;
  local_4b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set(&local_4b8);
  jessilib::object::
  get<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            (&local_478,(object *)&gtest_ar_.message_,&local_4b8);
  local_439 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ::empty(&local_478);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set(&local_478);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set(&local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__6.message_,local_438,
               "obj.get<std::unordered_set<long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=(local_4c8,local_4c0);
    testing::internal::AssertHelper::~AssertHelper(local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_578._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_578._M_h._M_rehash_policy._4_4_ = 0;
  local_578._M_h._M_rehash_policy._M_next_resize = 0;
  local_578._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_578._M_h._M_element_count = 0;
  local_578._M_h._M_buckets = (__buckets_ptr)0x0;
  local_578._M_h._M_bucket_count = 0;
  local_578._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_set(&local_578);
  jessilib::object::
  get<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_nullptr>
            (&local_538,(object *)&gtest_ar_.message_,&local_578);
  local_4f9 = std::
              unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              ::empty(&local_538);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_set(&local_538);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_set(&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__7.message_,local_4f8,
               "obj.get<std::unordered_set<long long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=(local_588,local_580);
    testing::internal::AssertHelper::~AssertHelper(local_588);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_638._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_638._M_h._M_rehash_policy._4_4_ = 0;
  local_638._M_h._M_rehash_policy._M_next_resize = 0;
  local_638._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_638._M_h._M_element_count = 0;
  local_638._M_h._M_buckets = (__buckets_ptr)0x0;
  local_638._M_h._M_bucket_count = 0;
  local_638._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set(&local_638);
  jessilib::object::
  get<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            (&local_5f8,(object *)&gtest_ar_.message_,&local_638);
  local_5b9 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ::empty(&local_5f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set(&local_5f8);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set(&local_638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__8.message_,local_5b8,
               "obj.get<std::unordered_set<intmax_t>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=(local_648,local_640);
    testing::internal::AssertHelper::~AssertHelper(local_648);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  local_6f8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_6f8._M_h._M_rehash_policy._4_4_ = 0;
  local_6f8._M_h._M_rehash_policy._M_next_resize = 0;
  local_6f8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_6f8._M_h._M_element_count = 0;
  local_6f8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_6f8._M_h._M_bucket_count = 0;
  local_6f8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  unordered_set(&local_6f8);
  jessilib::object::
  get<std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_nullptr>
            (&local_6b8,(object *)&gtest_ar_.message_,&local_6f8);
  local_679 = std::
              unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
              empty(&local_6b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_678,&local_679,(type *)0x0);
  std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  ~unordered_set(&local_6b8);
  std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  ~unordered_set(&local_6f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(local_700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__9.message_,local_678,
               "obj.get<std::unordered_set<float>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=(local_708,local_700);
    testing::internal::AssertHelper::~AssertHelper(local_708);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  local_7b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_7b8._M_h._M_rehash_policy._4_4_ = 0;
  local_7b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_7b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_7b8._M_h._M_element_count = 0;
  local_7b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_7b8._M_h._M_bucket_count = 0;
  local_7b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
  unordered_set(&local_7b8);
  jessilib::object::
  get<std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_nullptr>
            (&local_778,(object *)&gtest_ar_.message_,&local_7b8);
  local_739 = std::
              unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              ::empty(&local_778);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_738,&local_739,(type *)0x0);
  std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
  ~unordered_set(&local_778);
  std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>::
  ~unordered_set(&local_7b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(local_7c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__10.message_,local_738,
               "obj.get<std::unordered_set<double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=(local_7c8,local_7c0);
    testing::internal::AssertHelper::~AssertHelper(local_7c8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  local_878._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_878._M_h._M_rehash_policy._4_4_ = 0;
  local_878._M_h._M_rehash_policy._M_next_resize = 0;
  local_878._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_878._M_h._M_element_count = 0;
  local_878._M_h._M_buckets = (__buckets_ptr)0x0;
  local_878._M_h._M_bucket_count = 0;
  local_878._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::unordered_set(&local_878);
  jessilib::object::
  get<std::unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_std::unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_nullptr>
            (&local_838,(object *)&gtest_ar_.message_,&local_878);
  local_7f9 = std::
              unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              ::empty(&local_838);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7f8,&local_7f9,(type *)0x0);
  std::
  unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::~unordered_set(&local_838);
  std::
  unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::~unordered_set(&local_878);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__11.message_,local_7f8,
               "obj.get<std::unordered_set<long double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_888,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x136,pcVar2);
    testing::internal::AssertHelper::operator=(local_888,local_880);
    testing::internal::AssertHelper::~AssertHelper(local_888);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  local_938._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_938._M_h._M_rehash_policy._4_4_ = 0;
  local_938._M_h._M_rehash_policy._M_next_resize = 0;
  local_938._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_938._M_h._M_element_count = 0;
  local_938._M_h._M_buckets = (__buckets_ptr)0x0;
  local_938._M_h._M_bucket_count = 0;
  local_938._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::unordered_set(&local_938);
  jessilib::object::
  get<std::unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&local_8f8,(object *)&gtest_ar_.message_,&local_938);
  local_8b9 = std::
              unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ::empty(&local_8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8b8,&local_8b9,(type *)0x0);
  std::
  unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~unordered_set(&local_8f8);
  std::
  unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~unordered_set(&local_938);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(local_940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__12.message_,local_8b8,
               "obj.get<std::unordered_set<std::u8string>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=(local_948,local_940);
    testing::internal::AssertHelper::~AssertHelper(local_948);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  local_9f8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_9f8._M_h._M_rehash_policy._4_4_ = 0;
  local_9f8._M_h._M_rehash_policy._M_next_resize = 0;
  local_9f8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9f8._M_h._M_element_count = 0;
  local_9f8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_9f8._M_h._M_bucket_count = 0;
  local_9f8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::unordered_set(&local_9f8);
  jessilib::object::
  get<std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_9b8,(object *)&gtest_ar_.message_,&local_9f8);
  local_979 = std::
              unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              ::empty(&local_9b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_978,&local_979,(type *)0x0);
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~unordered_set(&local_9b8);
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~unordered_set(&local_9f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(local_a00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a28,local_978,
               "obj.get<std::unordered_set<object>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_a28);
    testing::internal::AssertHelper::AssertHelper
              (local_a08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=(local_a08,local_a00);
    testing::internal::AssertHelper::~AssertHelper(local_a08);
    std::__cxx11::string::~string((string *)&local_a28);
    testing::Message::~Message(local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  jessilib::object::~object((object *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_unordered_set) {
	object obj;

	EXPECT_TRUE(obj.get<std::unordered_set<bool>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<short>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<int>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<float>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<object>>().empty());
}